

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O2

size_t __thiscall
std::hash<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::operator()
          (hash<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *this,
          AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *x)

{
  size_t sVar1;
  ulong uVar2;
  hash<mp::AlgConRhs<0>_> local_1a;
  hash<mp::QuadAndLinTerms> local_19;
  
  sVar1 = hash<mp::QuadAndLinTerms>::operator()(&local_19,&x->super_QuadAndLinTerms);
  uVar2 = sVar1 + 0x9e3779b9;
  sVar1 = hash<mp::AlgConRhs<0>_>::operator()(&local_1a,(AlgConRhs<0>)(x->super_AlgConRhs<0>).rhs_);
  return sVar1 + (uVar2 >> 2) + uVar2 * 0x40 + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t operator()(
        const mp::AlgebraicConstraint<Body, RangeOrRhs>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(std::hash<RangeOrRhs>{}(x.GetRhsOrRange()));
    return hs.FinalizeHashValue();
  }